

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,SSTableDic *dic)

{
  ulong *puVar1;
  pointer ppVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  pointer ppVar9;
  
  memset(this,0,0x2800);
  ppVar2 = (dic->
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = (dic->
                super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
    uVar3 = (ppVar9->first * -0x783c846eeebdac2b >> 0x21 | ppVar9->first * -0x775ed61580000000) *
            0x4cf5ad432745937f ^ 9;
    uVar6 = uVar3 + 9;
    uVar3 = uVar3 + 0x12;
    uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
    uVar8 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
    uVar6 = (uVar3 >> 0x21 ^ uVar3) * -0xae502812aa7333;
    uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
    uVar6 = uVar6 >> 0x21 ^ uVar6;
    uVar3 = (uVar8 >> 0x21 ^ uVar8) + uVar6;
    uVar6 = uVar6 + uVar3;
    uVar4 = (int)uVar3 + (int)((uVar3 & 0xffffffff) / 0x14000 << 0xe) * -5;
    uVar5 = (int)(uVar3 >> 0x20) + (int)(uVar3 / 0x1400000000000 << 0xe) * -5;
    uVar7 = (int)uVar6 + (int)((uVar6 & 0xffffffff) / 0x14000 << 0xe) * -5;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)(uVar4 >> 3 & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
    uVar4 = (int)(uVar6 >> 0x20) + (int)(uVar6 / 0x1400000000000 << 0xe) * -5;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)(uVar5 >> 3 & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)(uVar7 >> 3 & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)(uVar4 >> 3 & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(const SSTableDic &dic) {
  for (const auto &pair : dic) {
    unsigned int hash[4] = {0};
    MurmurHash3_x64_128(&pair.first, sizeof(pair.first), 1, &hash);
    bits[hash[0] % (10240 * 8)] = true;
    bits[hash[1] % (10240 * 8)] = true;
    bits[hash[2] % (10240 * 8)] = true;
    bits[hash[3] % (10240 * 8)] = true;
  }
}